

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O3

int twin_messenger_subscribe
              (TWIN_MESSENGER_HANDLE twin_msgr_handle,
              TWIN_STATE_UPDATE_CALLBACK on_twin_state_update_callback,void *context)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  TWIN_MESSENGER_INSTANCE_conflict *twin_msgr;
  
  if (twin_msgr_handle == (TWIN_MESSENGER_HANDLE)0x0 ||
      on_twin_state_update_callback == (TWIN_STATE_UPDATE_CALLBACK)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x758;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"twin_messenger_subscribe",0x757,1,
                "Invalid argument (twin_msgr_handle=%p, on_twin_state_update_callback=%p)",
                twin_msgr_handle,on_twin_state_update_callback);
    }
  }
  else {
    iVar2 = 0;
    if (twin_msgr_handle->subscription_state == TWIN_SUBSCRIPTION_STATE_NOT_SUBSCRIBED) {
      twin_msgr_handle->on_message_received_callback = on_twin_state_update_callback;
      twin_msgr_handle->on_message_received_context = context;
      twin_msgr_handle->subscription_state = TWIN_SUBSCRIPTION_STATE_GET_COMPLETE_PROPERTIES;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int twin_messenger_subscribe(TWIN_MESSENGER_HANDLE twin_msgr_handle, TWIN_STATE_UPDATE_CALLBACK on_twin_state_update_callback, void* context)
{
    int result;

    if (twin_msgr_handle == NULL || on_twin_state_update_callback == NULL)
    {
        LogError("Invalid argument (twin_msgr_handle=%p, on_twin_state_update_callback=%p)", twin_msgr_handle, on_twin_state_update_callback);
        result = MU_FAILURE;
    }
    else
    {
        TWIN_MESSENGER_INSTANCE* twin_msgr = (TWIN_MESSENGER_INSTANCE*)twin_msgr_handle;

        if (twin_msgr->subscription_state != TWIN_SUBSCRIPTION_STATE_NOT_SUBSCRIBED)
        {
            result = RESULT_OK;
        }
        else
        {
            twin_msgr->on_message_received_callback = on_twin_state_update_callback;
            twin_msgr->on_message_received_context = context;
            twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_GET_COMPLETE_PROPERTIES;
            result = RESULT_OK;
        }
    }

    return result;
}